

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ItemSize(ImVec2 *size,float text_offset_y)

{
  float fVar1;
  undefined8 uVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *g;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec2 IVar13;
  float fVar14;
  float fVar15;
  
  pIVar4 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if (pIVar3->SkipItems == false) {
    fVar9 = (pIVar3->DC).CursorPos.x + size->x;
    fVar1 = (pIVar3->DC).CursorPos.y;
    fVar8 = size->y;
    (pIVar3->DC).CursorPosPrevLine.x = fVar9;
    (pIVar3->DC).CursorPosPrevLine.y = fVar1;
    fVar12 = (pIVar4->Style).ItemSpacing.y;
    IVar13 = (pIVar3->DC).CursorMaxPos;
    fVar10 = IVar13.x;
    fVar11 = IVar13.y;
    uVar2 = *(undefined8 *)&(pIVar3->DC).CurrentLineSize.y;
    fVar14 = (float)uVar2;
    fVar15 = (float)((ulong)uVar2 >> 0x20);
    uVar5 = -(uint)(fVar8 <= fVar14);
    uVar6 = -(uint)(text_offset_y <= fVar15);
    fVar8 = (float)(~uVar5 & (uint)fVar8 | (uint)fVar14 & uVar5);
    IVar13.x = (float)(int)((pIVar3->Pos).x + (pIVar3->DC).Indent.x + (pIVar3->DC).ColumnsOffset.x);
    IVar13.y = (float)(int)(fVar8 + fVar1 + fVar12);
    (pIVar3->DC).CursorPos = IVar13;
    fVar12 = IVar13.y - fVar12;
    uVar5 = -(uint)(fVar9 <= fVar10);
    uVar7 = -(uint)(fVar12 <= fVar11);
    (pIVar3->DC).CursorMaxPos =
         (ImVec2)(CONCAT44(~uVar7 & (uint)fVar12,~uVar5 & (uint)fVar9) |
                 CONCAT44((uint)fVar11 & uVar7,(uint)fVar10 & uVar5));
    (pIVar3->DC).PrevLineSize.y = fVar8;
    (pIVar3->DC).PrevLineTextBaseOffset =
         (float)(~uVar6 & (uint)text_offset_y | (uint)fVar15 & uVar6);
    *(undefined8 *)&(pIVar3->DC).CurrentLineSize.y = 0;
    if ((pIVar3->DC).LayoutType == 0) {
      pIVar3 = pIVar4->CurrentWindow;
      pIVar3->WriteAccessed = true;
      if (pIVar3->SkipItems == false) {
        (pIVar3->DC).CursorPos.x = (pIVar4->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
        (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
        (pIVar3->DC).CurrentLineSize = (pIVar3->DC).PrevLineSize;
        (pIVar3->DC).CurrentLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
        return;
      }
    }
  }
  return;
}

Assistant:

void ImGui::ItemSize(const ImVec2& size, float text_offset_y)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    // Always align ourselves on pixel boundaries
    const float line_height = ImMax(window->DC.CurrentLineSize.y, size.y);
    const float text_base_offset = ImMax(window->DC.CurrentLineTextBaseOffset, text_offset_y);
    //if (g.IO.KeyAlt) window->DrawList->AddRect(window->DC.CursorPos, window->DC.CursorPos + ImVec2(size.x, line_height), IM_COL32(255,0,0,200)); // [DEBUG]
    window->DC.CursorPosPrevLine = ImVec2(window->DC.CursorPos.x + size.x, window->DC.CursorPos.y);
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->DC.CursorPos.y = (float)(int)(window->DC.CursorPos.y + line_height + g.Style.ItemSpacing.y);
    window->DC.CursorMaxPos.x = ImMax(window->DC.CursorMaxPos.x, window->DC.CursorPosPrevLine.x);
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, window->DC.CursorPos.y - g.Style.ItemSpacing.y);
    //if (g.IO.KeyAlt) window->DrawList->AddCircle(window->DC.CursorMaxPos, 3.0f, IM_COL32(255,0,0,255), 4); // [DEBUG]

    window->DC.PrevLineSize.y = line_height;
    window->DC.PrevLineTextBaseOffset = text_base_offset;
    window->DC.CurrentLineSize.y = window->DC.CurrentLineTextBaseOffset = 0.0f;

    // Horizontal layout mode
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
        SameLine();
}